

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::AggregationPS::execute
          (AggregationPS *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s,
          VectorBase<double> *r,DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  undefined8 uVar1;
  int iVar2;
  pointer pdVar3;
  Nonzero<double> *pNVar4;
  undefined1 auVar5 [16];
  double dVar6;
  bool bVar7;
  VarStatus *pVVar8;
  undefined8 *puVar9;
  int iVar10;
  VarStatus VVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  int iVar15;
  long in_FS_OFFSET;
  double dVar16;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  
  iVar10 = this->m_i;
  iVar15 = this->m_old_i;
  if (iVar10 != iVar15) {
    pdVar3 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar15] = pdVar3[iVar10];
    pdVar3 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar15] = pdVar3[iVar10];
    rStatus->data[iVar15] = rStatus->data[iVar10];
  }
  iVar10 = this->m_j;
  iVar15 = this->m_old_j;
  if (iVar10 != iVar15) {
    pdVar3 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar15] = pdVar3[iVar10];
    pdVar3 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3[iVar15] = pdVar3[iVar10];
    cStatus->data[iVar15] = cStatus->data[iVar10];
  }
  pNVar4 = (this->m_row).super_SVectorBase<double>.m_elem;
  dVar16 = 0.0;
  uVar17 = 0;
  uVar18 = 0;
  if ((pNVar4 != (Nonzero<double> *)0x0) &&
     (lVar12 = (long)(this->m_row).super_SVectorBase<double>.memused, 0 < lVar12)) {
    lVar14 = 0;
    do {
      if (*(int *)((long)&pNVar4->idx + lVar14) == iVar10) {
        uVar1 = *(undefined8 *)((long)&pNVar4->val + lVar14);
        uVar17 = (undefined4)uVar1;
        uVar18 = (undefined4)((ulong)uVar1 >> 0x20);
        goto LAB_001f8137;
      }
      lVar14 = lVar14 + 0x10;
    } while (lVar12 * 0x10 != lVar14);
    uVar17 = 0;
    uVar18 = 0;
  }
LAB_001f8137:
  iVar15 = -1;
  lVar12 = 0;
  bVar7 = true;
  do {
    bVar13 = bVar7;
    iVar2 = pNVar4[lVar12].idx;
    if (iVar2 != iVar10) {
      dVar16 = pNVar4[lVar12].val *
               (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar2];
      iVar15 = iVar2;
    }
    lVar12 = 1;
    bVar7 = false;
  } while (bVar13);
  dVar6 = ABS(this->m_rhs);
  auVar19._8_8_ = dVar16;
  auVar19._0_8_ = this->m_rhs;
  if (dVar6 <= ABS(dVar16)) {
    dVar6 = ABS(dVar16);
  }
  dVar16 = 1.0;
  if (1.0 <= dVar6) {
    dVar16 = dVar6;
  }
  auVar5._8_8_ = dVar16;
  auVar5._0_8_ = dVar16;
  auVar19 = divpd(auVar19,auVar5);
  dStack_40 = auVar19._8_8_;
  local_48 = auVar19._0_8_ - dStack_40;
  (*(this->super_PostStep)._vptr_PostStep[7])();
  iVar10 = this->m_j;
  pdVar3 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3[iVar10] =
       ((double)(~-(ulong)(ABS(local_48) <= extraout_XMM0_Qa) & (ulong)local_48) * dVar16) /
       (double)CONCAT44(uVar18,uVar17);
  (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[this->m_i] = this->m_rhs;
  if ((isOptimal) &&
     ((dVar16 = pdVar3[iVar10], dVar6 = this->m_lower,
      (*(this->super_PostStep)._vptr_PostStep[6])(this), dVar16 - dVar6 < -extraout_XMM0_Qa_00 ||
      (dVar16 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[this->m_j], dVar6 = this->m_upper,
      (*(this->super_PostStep)._vptr_PostStep[6])(), extraout_XMM0_Qa_01 < dVar16 - dVar6)))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"EMAISM: numerical violation after disaggregating variable",
               0x39);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  lVar12 = (long)(this->m_col).super_SVectorBase<double>.memused;
  pdVar3 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar12 < 1) {
    dVar16 = 0.0;
  }
  else {
    pNVar4 = (this->m_col).super_SVectorBase<double>.m_elem;
    dVar16 = 0.0;
    lVar14 = 0;
    do {
      iVar10 = *(int *)((long)&pNVar4->idx + lVar14);
      if (iVar10 != this->m_i) {
        dVar16 = dVar16 + *(double *)((long)&pNVar4->val + lVar14) * pdVar3[iVar10];
      }
      lVar14 = lVar14 + 0x10;
    } while (lVar12 * 0x10 != lVar14);
  }
  pdVar3[this->m_i] = (this->m_obj - dVar16) / (double)CONCAT44(uVar18,uVar17);
  (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[this->m_j] = 0.0;
  pVVar8 = cStatus->data;
  VVar11 = pVVar8[iVar15];
  if ((VVar11 & ~FIXED) == ON_UPPER) {
    dVar16 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar15];
    dVar6 = this->m_oldupper;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    if (ABS(dVar16 - dVar6) <= extraout_XMM0_Qa_02) {
      pVVar8 = cStatus->data;
      VVar11 = pVVar8[iVar15];
      goto LAB_001f837a;
    }
LAB_001f83ba:
    cStatus->data[iVar15] = BASIC;
    (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar15] = 0.0;
    dVar16 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[this->m_j];
    dVar6 = this->m_upper;
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    iVar10 = this->m_j;
    if (extraout_XMM0_Qa_04 < ABS(dVar16 - dVar6)) {
      dVar16 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar10];
      dVar6 = this->m_lower;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      if (ABS(dVar16 - dVar6) <= extraout_XMM0_Qa_05) {
        iVar10 = this->m_j;
        pVVar8 = cStatus->data;
        VVar11 = ON_LOWER;
      }
      else {
        dVar16 = this->m_upper;
        ::soplex::infinity::__tls_init();
        dVar6 = *(double *)(in_FS_OFFSET + -8);
        if ((dVar16 < dVar6) ||
           (dVar16 = this->m_lower, ::soplex::infinity::__tls_init(), -dVar6 < dVar16)) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_68 = local_58;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,
                     "XMAISM unexpected basis status in aggregation unsimplifier.","");
          *puVar9 = &PTR__SPxException_0069d438;
          puVar9[1] = puVar9 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar9 + 1),local_68,local_68 + local_60);
          *puVar9 = &PTR__SPxException_0069d410;
          __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        iVar10 = this->m_j;
        pVVar8 = cStatus->data;
        VVar11 = ZERO;
      }
    }
    else {
      pVVar8 = cStatus->data;
      VVar11 = ON_UPPER;
    }
  }
  else {
LAB_001f837a:
    if (VVar11 - ON_LOWER < 2) {
      dVar16 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar15];
      dVar6 = this->m_oldlower;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      if (extraout_XMM0_Qa_03 < ABS(dVar16 - dVar6)) goto LAB_001f83ba;
      pVVar8 = cStatus->data;
    }
    iVar10 = this->m_j;
    VVar11 = BASIC;
  }
  pVVar8[iVar10] = VVar11;
  rStatus->data[this->m_i] = ON_UPPER;
  return;
}

Assistant:

void SPxMainSM<R>::AggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];
   int active_idx = -1;

   assert(m_row.size() == 2);

   for(int k = 0; k < 2; ++k)
   {
      if(m_row.index(k) != m_j)
      {
         active_idx = m_row.index(k);
         val = m_row.value(k) * x[active_idx];
      }
   }

   assert(active_idx >= 0);

   R scale = maxAbs(m_rhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_rhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_rhs;

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
   {
      SPX_MSG_ERROR(std::cerr << "EMAISM: numerical violation after disaggregating variable" << std::endl;
                   )
   }

   // dual:
   R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   if(((cStatus[active_idx] == SPxSolverBase<R>::ON_UPPER
         || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
         && NE(x[active_idx], m_oldupper, this->feastol())) ||
         ((cStatus[active_idx] == SPxSolverBase<R>::ON_LOWER
           || cStatus[active_idx] == SPxSolverBase<R>::FIXED)
          && NE(x[active_idx], m_oldlower, this->feastol())))
   {
      cStatus[active_idx] = SPxSolverBase<R>::BASIC;
      r[active_idx] = 0.0;
      assert(NE(m_upper, m_lower, this->epsilon()));

      if(EQ(x[m_j], m_upper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(EQ(x[m_j], m_lower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(m_upper >= R(infinity) && m_lower <= R(-infinity))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM unexpected basis status in aggregation unsimplifier.");
   }
   else
   {
      cStatus[m_j] = SPxSolverBase<R>::BASIC;
   }

   // sides may not be equal and we always only consider the rhs during aggregation, so set ON_UPPER
   // (in theory and with exact arithmetic setting it to FIXED would be correct)
   rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}